

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_fits.c
# Opt level: O1

void sfts_write_image(sfts_t *f,void *pix,size_t w,size_t h,int t)

{
  int *status;
  int iVar1;
  void *__dest;
  sbyte sVar2;
  size_t __n;
  size_t sVar3;
  char *fmt;
  char *errtext;
  void *__src;
  bool bVar4;
  long pels [2];
  char _msg [31];
  
  errtext = (char *)(ulong)(uint)t;
  pels[0]._0_4_ = 1;
  pels[0]._4_4_ = 0;
  pels[1] = 1;
  if (t < 0x40) {
    sVar2 = 1;
    if (t == 2) {
      iVar1 = 0x14;
    }
    else {
      if (t == 4) {
        iVar1 = 0x1e;
        goto LAB_00108eb7;
      }
      if (t != 0x20) {
LAB_00108ff3:
        fmt = "FITS: data type not implemented: %d";
        iVar1 = 0x18b;
        goto LAB_00108fe0;
      }
      iVar1 = 0x15;
    }
  }
  else {
    if (t == 0x40) {
      iVar1 = 0x1f;
    }
    else {
      if (t != 0x100) {
        if (t != 0x200) goto LAB_00108ff3;
        iVar1 = 0x52;
        sVar2 = 3;
        goto LAB_00108ebc;
      }
      iVar1 = 0x2a;
    }
LAB_00108eb7:
    sVar2 = 2;
  }
LAB_00108ebc:
  status = &f->stat;
  __n = (size_t)((int)w << sVar2);
  __dest = (void *)g_malloc(__n);
  if (h != 0) {
    __src = (void *)((long)pix + (h - 1) * __n);
    sVar3 = 1;
    do {
      pels[1] = sVar3;
      memcpy(__dest,__src,__n);
      ffppx(f->fts,iVar1,pels,w,__dest,status);
      __src = (void *)((long)__src - __n);
      bVar4 = sVar3 != h;
      sVar3 = sVar3 + 1;
    } while (bVar4);
  }
  g_free(__dest);
  ffpcks(f->fts,status);
  if (f->stat == 0) {
    return;
  }
  if (f->name == (char *)0x0) {
    g_strdup("memory");
  }
  else {
    g_path_get_basename();
  }
  errtext = _msg;
  ffgerr(*status,errtext);
  _msg[0x1e] = '\0';
  fmt = "FITS: %s: %s";
  iVar1 = 0x198;
LAB_00108fe0:
  _p2sc_msg("sfts_write_image",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_fits.c"
            ,iVar1,"$Id: p2sc_fits.c 5204 2015-04-30 19:12:42Z bogdan $",0x11f8,fmt,errtext);
  exit(1);
}

Assistant:

void sfts_write_image(sfts_t *f, const void *pix, size_t w, size_t h, int t) {
    int *s = &f->stat, ft, ls;
    long pels[] = { 1, 1 };

    switch (t) {
    case SUINT16:
        ft = TUSHORT;
        ls = w * sizeof(guint16);
        break;
    case SUINT32:
        ft = TUINT;
        ls = w * sizeof(guint32);
        break;
    case SINT16:
        ft = TSHORT;
        ls = w * sizeof(gint16);
        break;
    case SINT32:
        ft = TINT;
        ls = w * sizeof(gint32);
        break;
    case SFLOAT:
        ft = TFLOAT;
        ls = w * sizeof(float);
        break;
    case SDOUBLE:
        ft = TDOUBLE;
        ls = w * sizeof(double);
        break;
    default:
        P2SC_Msg(LVL_FATAL_FITS, "FITS: data type not implemented: %d", t);
        return;
    }

    void *line = g_malloc(ls);
    for (size_t j = 0; j < h; ++j) {
        pels[1] = j + 1;
        memcpy(line, (const guint8 *) pix + (h - 1 - j) * ls, ls);
        fits_write_pix(f->fts, ft, pels, w, line, s);
    }
    g_free(line);

    fits_write_chksum(f->fts, s);
    CHK_FTS(f);
}